

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetProperty_Internal<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,Var value,PropertyOperationFlags flags,PropertyValueInfo *info,
          bool isInit)

{
  ScriptContext *this_00;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  byte bVar7;
  DynamicObject *instance_00;
  int local_5c;
  PropertyRecord *pPStack_58;
  int i;
  PropertyRecord *propertyRecord;
  DynamicObject *local_48;
  DictionaryPropertyDescriptor<unsigned_short> *local_40;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  local_48 = instance;
  descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)this;
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar3)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar1 = this_00->threadContext;
    (pTVar1->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar1->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    propertyRecord = (PropertyRecord *)info;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x34d,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_00db11ef;
    *puVar6 = 0;
    info = (PropertyValueInfo *)propertyRecord;
  }
  pPStack_58 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)descriptor[3],&stack0xffffffffffffffa8,&local_40,&local_5c);
  if (!bVar3) {
    if (pPStack_58->isNumeric == true) {
      uVar4 = PropertyRecord::GetNumericValue(pPStack_58);
      BVar5 = (**(code **)((long)*descriptor + 0x168))(descriptor,local_48,uVar4,value,flags);
      return BVar5;
    }
    BVar5 = AddProperty((DictionaryTypeHandlerBase<unsigned_short> *)descriptor,local_48,pPStack_58,
                        value,'\a',info,flags,
                        (flags & (PropertyOperation_ThrowIfNotExtensible|
                                 PropertyOperation_StrictMode)) != PropertyOperation_None,
                        SideEffects_Any);
    return BVar5;
  }
  if (((local_40->flags & (UsedAsFixed|IsFixed)) != None) &&
     (((local_40->Attributes & 8) != 0 ||
      (((local_40->Data == 0xffff && (local_40->Getter == 0xffff)) && (local_40->Setter == 0xffff)))
      ))) {
    AssertCount = AssertCount + 1;
    propertyRecord = (PropertyRecord *)info;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x352,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar3) {
LAB_00db11ef:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    info = (PropertyValueInfo *)propertyRecord;
  }
  if ((local_40->Attributes & 8) == 0) {
    instance_00 = local_48;
    if ((!isInit) || ((local_40->flags & IsAccessor) == None)) goto LAB_00db11b7;
  }
  else {
    if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar3 = DynamicTypeHandler::VerifyIsExtensible
                          ((DynamicTypeHandler *)descriptor,this_00,
                           (flags & (PropertyOperation_ThrowIfNotExtensible|
                                    PropertyOperation_StrictMode)) != PropertyOperation_None),
       !bVar3)) {
      return 0;
    }
    ScriptContext::InvalidateProtoCaches(this_00,propertyId);
    instance_00 = local_48;
    bVar7 = 7;
    if ((local_40->Attributes & 0x10) != 0) {
      bVar7 = local_40->Attributes & 0xd0 | 7;
    }
    local_40->Attributes = bVar7;
    DynamicObject::SetHasNoEnumerableProperties(local_48,false);
  }
  DictionaryPropertyDescriptor<unsigned_short>::ConvertToData(local_40);
LAB_00db11b7:
  SetPropertyWithDescriptor<true>
            ((DictionaryTypeHandlerBase<unsigned_short> *)descriptor,instance_00,pPStack_58,
             &local_40,value,flags,info);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info, bool isInit)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
        bool isForce = (flags & PropertyOperation_Force) != 0;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return false;
                    }
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
                instance->SetHasNoEnumerableProperties(false);
                descriptor->ConvertToData();
            }
            else if (!allowLetConstGlobal && descriptor->HasNonLetConstGlobal() && !(descriptor->Attributes & PropertyWritable))
            {
                if (!isForce)
                {
                    JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);
                }

                // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
                // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads.  This
                // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
                // the local cache (that would be illegal), but still populate the type's property cache.
                PropertyValueInfo::SetNoCache(info, instance);
                return false;
            }
            else if (isInit && descriptor->GetIsAccessor())
            {
                descriptor->ConvertToData();
            }
            SetPropertyWithDescriptor<allowLetConstGlobal>(instance, propertyRecord, &descriptor, value, flags, info);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }
        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, throwIfNotExtensible, SideEffects_Any);
        }